

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O0

void anon_unknown.dwarf_21e8e4::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int W,int H,LineOrder lorder,Compression comp,
               LevelRoundingMode rmode,int dx,int dy,int xSize,int ySize)

{
  string filename;
  undefined1 in_stack_0000100f;
  int in_stack_00001010;
  LineOrder in_stack_00001014;
  char *in_stack_00001018;
  Array2D<float> *in_stack_00001020;
  Array2D<Imath_3_2::half> *in_stack_00001028;
  Array2D<unsigned_int> *in_stack_00001030;
  int in_stack_00001040;
  int in_stack_00001048;
  int in_stack_00001050;
  int in_stack_00001058;
  int in_stack_00001060;
  Compression in_stack_00001068;
  LevelMode in_stack_00001070;
  LevelRoundingMode in_stack_00001078;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  string local_70 [72];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001030,in_stack_00001028,in_stack_00001020,in_stack_00001018,
            in_stack_00001014,in_stack_00001010,in_stack_00001040,in_stack_00001048,
            in_stack_00001050,in_stack_00001058,in_stack_00001060,in_stack_00001068,
            in_stack_00001070,in_stack_00001078,(bool)in_stack_0000100f);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001030,in_stack_00001028,in_stack_00001020,in_stack_00001018,
            in_stack_00001014,in_stack_00001010,in_stack_00001040,in_stack_00001048,
            in_stack_00001050,in_stack_00001058,in_stack_00001060,in_stack_00001068,
            in_stack_00001070,in_stack_00001078,(bool)in_stack_0000100f);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001030,in_stack_00001028,in_stack_00001020,in_stack_00001018,
            in_stack_00001014,in_stack_00001010,in_stack_00001040,in_stack_00001048,
            in_stack_00001050,in_stack_00001058,in_stack_00001060,in_stack_00001068,
            in_stack_00001070,in_stack_00001078,(bool)in_stack_0000100f);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001030,in_stack_00001028,in_stack_00001020,in_stack_00001018,
            in_stack_00001014,in_stack_00001010,in_stack_00001040,in_stack_00001048,
            in_stack_00001050,in_stack_00001058,in_stack_00001060,in_stack_00001068,
            in_stack_00001070,in_stack_00001078,(bool)in_stack_0000100f);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          W,
    int                          H,
    LineOrder                    lorder,
    Compression                  comp,
    LevelRoundingMode            rmode,
    int                          dx,
    int                          dy,
    int                          xSize,
    int                          ySize)
{
    std::string filename = tempDir + "imf_test_scanline_api.exr";

    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        MIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        RIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        true);
}